

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

char * pathsearch(char *argv0,char *name,int modemask)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcStack_48;
  char c;
  char *cp;
  char *path;
  char *pathbuf;
  char *pathbufptr;
  char *pathlist;
  int modemask_local;
  char *name_local;
  char *argv0_local;
  
  pcVar3 = strrchr(argv0,0x2f);
  if (pcVar3 == (char *)0x0) {
    pathbufptr = getenv("PATH");
    if (pathbufptr == (char *)0x0) {
      pathbufptr = ".:/bin:/usr/bin";
    }
    sVar4 = strlen(pathbufptr);
    pcVar3 = (char *)malloc((long)((int)sVar4 + 1));
    sVar4 = strlen(pathbufptr);
    sVar5 = strlen(name);
    cp = (char *)malloc((long)((int)sVar4 + (int)sVar5 + 2));
    if ((pcVar3 != (char *)0x0) && (cp != (char *)0x0)) {
      strcpy(pcVar3,pathbufptr);
      path = pcVar3;
      do {
        if (*path == '\0') break;
        pcStack_48 = strchr(path,0x3a);
        if (pcStack_48 == (char *)0x0) {
          sVar4 = strlen(path);
          pcStack_48 = path + (int)sVar4;
        }
        cVar1 = *pcStack_48;
        *pcStack_48 = '\0';
        sprintf(cp,"%s/%s",path,name);
        *pcStack_48 = cVar1;
        if (cVar1 == '\0') {
          *path = '\0';
        }
        else {
          path = pcStack_48 + 1;
        }
        iVar2 = access(cp,modemask);
      } while (iVar2 != 0);
      free(pcVar3);
    }
  }
  else {
    cVar1 = *pcVar3;
    *pcVar3 = '\0';
    sVar4 = strlen(argv0);
    sVar5 = strlen(name);
    cp = (char *)malloc((long)((int)sVar4 + (int)sVar5 + 2));
    if (cp != (char *)0x0) {
      sprintf(cp,"%s/%s",argv0,name);
    }
    *pcVar3 = cVar1;
  }
  return cp;
}

Assistant:

PRIVATE char *pathsearch(char *argv0, char *name, int modemask)
{
  const char *pathlist;
  char *pathbufptr;
  char *pathbuf;
  char *path,*cp;
  char c;

#ifdef __WIN32__
  cp = strrchr(argv0,'\\');
#else
  cp = strrchr(argv0,'/');
#endif
  if( cp ){
    c = *cp;
    *cp = 0;
    path = (char *)malloc( lemonStrlen(argv0) + lemonStrlen(name) + 2 );
    if( path ) sprintf(path,"%s/%s",argv0,name);
    *cp = c;
  }else{
    pathlist = getenv("PATH");
    if( pathlist==0 ) pathlist = ".:/bin:/usr/bin";
    pathbuf = (char *) malloc( lemonStrlen(pathlist) + 1 );
    path = (char *)malloc( lemonStrlen(pathlist)+lemonStrlen(name)+2 );
    if( (pathbuf != 0) && (path!=0) ){
      pathbufptr = pathbuf;
      strcpy(pathbuf, pathlist);
      while( *pathbuf ){
        cp = strchr(pathbuf,':');
        if( cp==0 ) cp = &pathbuf[lemonStrlen(pathbuf)];
        c = *cp;
        *cp = 0;
        sprintf(path,"%s/%s",pathbuf,name);
        *cp = c;
        if( c==0 ) pathbuf[0] = 0;
        else pathbuf = &cp[1];
        if( access(path,modemask)==0 ) break;
      }
      free(pathbufptr);
    }
  }
  return path;
}